

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O3

Path * pathSolve(Path *param_1,int *param_2,int param_3,int param_4)

{
  ulong uVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  TileNode *pTVar5;
  int iVar6;
  ulong uVar7;
  TileNode *pTVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  Path *pPVar12;
  Path *pPVar13;
  int iVar14;
  long lVar15;
  undefined8 *puVar16;
  TileNode *pTVar17;
  undefined8 *puVar18;
  uint uVar19;
  int iVar20;
  byte bVar21;
  undefined8 auStack_548 [159];
  long local_50;
  Path *local_48;
  ulong local_40;
  long local_38;
  
  bVar21 = 0;
  local_50 = (long)param_3;
  local_48 = param_1;
  do {
    pPVar13 = local_48;
    iVar20 = param_4 + -1;
    iVar14 = iVar20 >> 0x1f;
    iVar6 = iVar20 / 0x48 + iVar14;
    uVar19 = iVar6 - iVar14;
    uVar11 = (ulong)uVar19;
    uVar19 = param_4 + uVar19 * -0x48;
    iVar9 = (iVar6 - iVar14) + 1;
    iVar6 = uVar19 + iVar9 * 0x48;
    iVar14 = *param_2;
    if (iVar14 != iVar6) {
      uVar7 = 0xffffffffffffffff;
      do {
        if (uVar7 == 0x47e) goto LAB_0010299e;
        uVar1 = uVar7 + 1;
        lVar15 = uVar7 + 2;
        uVar7 = uVar1;
      } while (param_2[lVar15] != iVar6);
      iVar6 = iVar14;
      if (0x47e < uVar1) {
LAB_0010299e:
        bVar2 = (&stack0x00000054)[(long)(int)uVar19 + (long)iVar9 * 0x49];
        if ((bVar2 - 0x23 < 4) || (iVar6 = iVar14, bVar2 == 0x2e)) {
          param_2[local_50] = param_4;
          local_40 = uVar11;
          pTVar8 = (TileNode *)malloc(0x10);
          pTVar8->next = (TileNode *)0x0;
          pTVar8->location = param_4;
          pTVar8->type = bVar2;
          uVar4 = pPVar13->count;
          pPVar12 = pPVar13;
          if (uVar4 != 0) {
            pTVar5 = pPVar13->first;
            do {
              pTVar17 = pTVar5;
              pTVar5 = pTVar17->next;
            } while (pTVar5 != (TileNode *)0x0);
            pPVar12 = (Path *)&pTVar17->next;
          }
          pPVar12->first = pTVar8;
          pPVar13->count = uVar4 + 1;
          iVar6 = (int)local_50;
          puVar16 = (undefined8 *)&stack0x00000008;
          puVar18 = auStack_548;
          for (lVar15 = 0x9e; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar18 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
          }
          pathSolve(pPVar13,param_2,iVar6 + 1,param_4 + 0x48);
          iVar6 = *param_2;
          uVar11 = local_40;
        }
      }
    }
    iVar14 = param_4 + 1;
    lVar15 = (long)(int)uVar11;
    if (iVar6 != iVar14) {
      uVar7 = 0xffffffffffffffff;
      do {
        if (uVar7 == 0x47e) goto LAB_00102a96;
        uVar1 = uVar7 + 1;
        lVar10 = uVar7 + 2;
        uVar7 = uVar1;
      } while (param_2[lVar10] != iVar14);
      if (0x47e < uVar1) {
LAB_00102a96:
        bVar2 = (&stack0x00000055)[(long)(int)uVar19 + lVar15 * 0x49];
        if ((bVar2 - 0x23 < 4) || (bVar2 == 0x2e)) {
          param_2[local_50] = param_4;
          local_40 = uVar11;
          local_38 = lVar15;
          pTVar8 = (TileNode *)malloc(0x10);
          pPVar13 = local_48;
          pTVar8->next = (TileNode *)0x0;
          pTVar8->location = param_4;
          pTVar8->type = bVar2;
          uVar4 = local_48->count;
          pPVar12 = local_48;
          if (uVar4 != 0) {
            pTVar5 = local_48->first;
            do {
              pTVar17 = pTVar5;
              pTVar5 = pTVar17->next;
            } while (pTVar5 != (TileNode *)0x0);
            pPVar12 = (Path *)&pTVar17->next;
          }
          pPVar12->first = pTVar8;
          local_48->count = uVar4 + 1;
          iVar6 = (int)local_50;
          puVar16 = (undefined8 *)&stack0x00000008;
          puVar18 = auStack_548;
          for (lVar15 = 0x9e; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar18 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
            puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
          }
          pathSolve(pPVar13,param_2,iVar6 + 1,iVar14);
          lVar15 = local_38;
          uVar11 = local_40;
        }
      }
    }
    if (0x48 < param_4) {
      iVar14 = (int)uVar11 + -1;
      iVar6 = uVar19 + iVar14 * 0x48;
      if (*param_2 != iVar6) {
        uVar11 = 0xffffffffffffffff;
        do {
          if (uVar11 == 0x47e) goto LAB_00102bab;
          uVar7 = uVar11 + 1;
          lVar10 = uVar11 + 2;
          uVar11 = uVar7;
        } while (param_2[lVar10] != iVar6);
        if (0x47e < uVar7) {
LAB_00102bab:
          bVar2 = (&stack0x00000054)[(long)(int)uVar19 + (long)iVar14 * 0x49];
          if ((bVar2 - 0x23 < 4) || (bVar2 == 0x2e)) {
            param_2[local_50] = param_4;
            pTVar8 = (TileNode *)malloc(0x10);
            pPVar13 = local_48;
            pTVar8->next = (TileNode *)0x0;
            pTVar8->location = param_4;
            pTVar8->type = bVar2;
            uVar4 = local_48->count;
            pPVar12 = local_48;
            if (uVar4 != 0) {
              pTVar5 = local_48->first;
              do {
                pTVar17 = pTVar5;
                pTVar5 = pTVar17->next;
              } while (pTVar5 != (TileNode *)0x0);
              pPVar12 = (Path *)&pTVar17->next;
            }
            pPVar12->first = pTVar8;
            local_48->count = uVar4 + 1;
            iVar6 = (int)local_50;
            puVar16 = (undefined8 *)&stack0x00000008;
            puVar18 = auStack_548;
            for (lVar10 = 0x9e; lVar10 != 0; lVar10 = lVar10 + -1) {
              *puVar18 = *puVar16;
              puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
              puVar18 = puVar18 + (ulong)bVar21 * -2 + 1;
            }
            pathSolve(pPVar13,param_2,iVar6 + 1,param_4 + -0x48);
          }
        }
      }
    }
    if (((int)uVar19 < 1) || (*param_2 == iVar20)) {
      return local_48;
    }
    uVar11 = 0xffffffffffffffff;
    do {
      if (uVar11 == 0x47e) goto LAB_00102ca6;
      uVar7 = uVar11 + 1;
      lVar10 = uVar11 + 2;
      uVar11 = uVar7;
    } while (param_2[lVar10] != iVar20);
    if (uVar7 < 0x47f) {
      return local_48;
    }
LAB_00102ca6:
    lVar15 = lVar15 * 0x49 + 0x54;
    if ((3 < (byte)(&stack0x00000054)[(int)(uVar19 - 1) + lVar15 + -0x54] - 0x23) &&
       ((&stack0x00000054)[(int)(uVar19 - 1) + lVar15 + -0x54] != 0x2e)) {
      return local_48;
    }
    param_2[local_50] = param_4;
    cVar3 = (&stack0x00000054)[(ulong)uVar19 + lVar15 + -0x54];
    pTVar8 = (TileNode *)malloc(0x10);
    pTVar8->next = (TileNode *)0x0;
    pTVar8->location = param_4;
    pTVar8->type = cVar3;
    uVar19 = local_48->count;
    pPVar13 = local_48;
    if (uVar19 != 0) {
      pTVar5 = local_48->first;
      do {
        pTVar17 = pTVar5;
        pTVar5 = pTVar17->next;
      } while (pTVar5 != (TileNode *)0x0);
      pPVar13 = (Path *)&pTVar17->next;
    }
    pPVar13->first = pTVar8;
    local_48->count = uVar19 + 1;
    local_50 = local_50 + 1;
    param_4 = iVar20;
  } while( true );
}

Assistant:

struct Path *pathSolve(struct Map map, struct Path *path, int prevChecked[],
    int count, int currentPosition) {
    int i, j, nextPosition, beingChecked;

    i = (currentPosition - 1) / MAP_COLS;
    j = currentPosition - (MAP_COLS * i);

    beingChecked = ((i + 1) * MAP_COLS) + j;

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i + 1][j])) {
        nextPosition = currentPosition + MAP_COLS;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i + 1][j]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = (i * MAP_COLS) + (j + 1);

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i][j + 1])) {
        nextPosition = currentPosition + 1;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i][j + 1]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = ((i - 1) * MAP_COLS) + j;

    if (i > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i - 1][j])) {
            nextPosition = currentPosition - MAP_COLS;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i - 1][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    beingChecked = (i * MAP_COLS) + (j - 1);

    if (j > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i][j - 1])) {
            nextPosition = currentPosition - 1;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    return path;
}